

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

string * __thiscall
CLI::ConfigINI::to_config
          (string *__return_storage_ptr__,ConfigINI *this,App *app,bool default_also,
          bool write_description,string *prefix)

{
  Option *this_00;
  App *pAVar1;
  byte bVar2;
  byte bVar3;
  bool bVar4;
  int iVar5;
  reference ppOVar6;
  const_reference __rhs;
  size_t sVar7;
  ulong uVar8;
  streamoff sVar9;
  ostream *poVar10;
  string *psVar11;
  reference ppAVar12;
  undefined1 auVar13 [16];
  byte local_4c1;
  bool local_4b1;
  string local_480;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_460;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_440;
  string local_420 [32];
  App *local_400;
  App *subcom;
  iterator __end1_1;
  iterator __begin1_1;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> local_3c8;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *local_3b0;
  vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_> *__range1_1;
  allocator local_381;
  string local_380;
  string local_360;
  undefined1 local_340 [16];
  string local_330;
  string local_310;
  byte local_2e9;
  string local_2e8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_2c8;
  string local_2b0;
  undefined1 local_290 [8];
  string value;
  undefined1 local_258 [8];
  string name;
  Option *opt;
  iterator __end1;
  iterator __begin1;
  function<bool_(const_CLI::Option_*)> local_1f8;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> local_1d8;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *local_1c0;
  vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_> *__range1;
  stringstream out;
  ostream local_1a8 [376];
  string *local_30;
  string *prefix_local;
  bool write_description_local;
  App *pAStack_20;
  bool default_also_local;
  App *app_local;
  ConfigINI *this_local;
  
  local_30 = prefix;
  prefix_local._6_1_ = write_description;
  prefix_local._7_1_ = default_also;
  pAStack_20 = app;
  app_local = (App *)this;
  this_local = (ConfigINI *)__return_storage_ptr__;
  ::std::__cxx11::stringstream::stringstream((stringstream *)&__range1);
  pAVar1 = pAStack_20;
  std::function<bool_(const_CLI::Option_*)>::function(&local_1f8);
  App::get_options(&local_1d8,pAVar1,&local_1f8);
  std::function<bool_(const_CLI::Option_*)>::~function(&local_1f8);
  local_1c0 = &local_1d8;
  __end1 = std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::begin(local_1c0);
  opt = (Option *)
        std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::end(local_1c0);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
                                *)&opt);
    if (!bVar4) break;
    ppOVar6 = __gnu_cxx::
              __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
              ::operator*(&__end1);
    this_00 = *ppOVar6;
    Option::get_lnames_abi_cxx11_
              ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&name.field_2 + 8),this_00);
    bVar4 = ::std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::empty((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)((long)&name.field_2 + 8));
    local_4b1 = false;
    if (!bVar4) {
      local_4b1 = OptionBase<CLI::Option>::get_configurable(&this_00->super_OptionBase<CLI::Option>)
      ;
    }
    ::std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&name.field_2 + 8));
    if (local_4b1 != false) {
      Option::get_lnames_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&value.field_2 + 8),this_00);
      __rhs = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)((long)&value.field_2 + 8),0);
      ::std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_258,prefix,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)__rhs);
      ::std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)&value.field_2 + 8));
      ::std::__cxx11::string::string((string *)local_290);
      iVar5 = Option::get_type_size(this_00);
      if (iVar5 == 0) {
        sVar7 = Option::count(this_00);
        if (sVar7 == 1) {
          ::std::__cxx11::string::operator=((string *)local_290,"true");
        }
        else {
          sVar7 = Option::count(this_00);
          if (sVar7 < 2) {
            sVar7 = Option::count(this_00);
            if ((sVar7 == 0) && ((prefix_local._7_1_ & 1) != 0)) {
              ::std::__cxx11::string::operator=((string *)local_290,"false");
            }
          }
          else {
            sVar7 = Option::count(this_00);
            ::std::__cxx11::to_string(&local_330,sVar7);
            ::std::__cxx11::string::operator=((string *)local_290,(string *)&local_330);
            ::std::__cxx11::string::~string((string *)&local_330);
          }
        }
      }
      else {
        sVar7 = Option::count(this_00);
        if (sVar7 == 0) {
          local_2e9 = 0;
          local_4c1 = 0;
          if ((prefix_local._7_1_ & 1) != 0) {
            Option::get_defaultval_abi_cxx11_(&local_2e8,this_00);
            local_2e9 = 1;
            local_4c1 = ::std::__cxx11::string::empty();
            local_4c1 = local_4c1 ^ 0xff;
          }
          if ((local_2e9 & 1) != 0) {
            ::std::__cxx11::string::~string((string *)&local_2e8);
          }
          if ((local_4c1 & 1) != 0) {
            Option::get_defaultval_abi_cxx11_(&local_310,this_00);
            ::std::__cxx11::string::operator=((string *)local_290,(string *)&local_310);
            ::std::__cxx11::string::~string((string *)&local_310);
          }
        }
        else {
          Option::results_abi_cxx11_(&local_2c8,this_00);
          detail::ini_join(&local_2b0,&local_2c8);
          ::std::__cxx11::string::operator=((string *)local_290,(string *)&local_2b0);
          ::std::__cxx11::string::~string((string *)&local_2b0);
          ::std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&local_2c8);
        }
      }
      uVar8 = ::std::__cxx11::string::empty();
      if ((uVar8 & 1) == 0) {
        if ((prefix_local._6_1_ & 1) != 0) {
          bVar4 = Option::has_description(this_00);
          if (bVar4) {
            auVar13 = ::std::ostream::tellp();
            local_340 = auVar13;
            sVar9 = ::std::fpos::operator_cast_to_long((fpos *)local_340);
            if ((int)sVar9 != 0) {
              ::std::ostream::operator<<(local_1a8,::std::endl<char,std::char_traits<char>>);
            }
            poVar10 = ::std::operator<<(local_1a8,"; ");
            ::std::allocator<char>::allocator();
            ::std::__cxx11::string::string((string *)&local_380,"; ",&local_381);
            psVar11 = Option::get_description_abi_cxx11_(this_00);
            ::std::__cxx11::string::string((string *)&__range1_1,(string *)psVar11);
            detail::fix_newlines(&local_360,&local_380,(string *)&__range1_1);
            poVar10 = ::std::operator<<(poVar10,(string *)&local_360);
            ::std::ostream::operator<<(poVar10,::std::endl<char,std::char_traits<char>>);
            ::std::__cxx11::string::~string((string *)&local_360);
            ::std::__cxx11::string::~string((string *)&__range1_1);
            ::std::__cxx11::string::~string((string *)&local_380);
            ::std::allocator<char>::~allocator((allocator<char> *)&local_381);
          }
        }
        iVar5 = Option::get_items_expected(this_00);
        if (iVar5 == 1) {
          poVar10 = ::std::operator<<(local_1a8,(string *)local_258);
          poVar10 = ::std::operator<<(poVar10,"=");
          psVar11 = detail::add_quotes_if_needed((string *)local_290);
          poVar10 = ::std::operator<<(poVar10,(string *)psVar11);
          ::std::ostream::operator<<(poVar10,::std::endl<char,std::char_traits<char>>);
        }
        else {
          poVar10 = ::std::operator<<(local_1a8,(string *)local_258);
          poVar10 = ::std::operator<<(poVar10,"=");
          poVar10 = ::std::operator<<(poVar10,(string *)local_290);
          ::std::ostream::operator<<(poVar10,::std::endl<char,std::char_traits<char>>);
        }
      }
      ::std::__cxx11::string::~string((string *)local_290);
      ::std::__cxx11::string::~string((string *)local_258);
    }
    __gnu_cxx::
    __normal_iterator<const_CLI::Option_**,_std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>_>
    ::operator++(&__end1);
  }
  std::vector<const_CLI::Option_*,_std::allocator<const_CLI::Option_*>_>::~vector(&local_1d8);
  pAVar1 = pAStack_20;
  std::function<bool_(const_CLI::App_*)>::function((function<bool_(const_CLI::App_*)> *)&__begin1_1)
  ;
  App::get_subcommands(&local_3c8,pAVar1,(function<bool_(const_CLI::App_*)> *)&__begin1_1);
  std::function<bool_(const_CLI::App_*)>::~function
            ((function<bool_(const_CLI::App_*)> *)&__begin1_1);
  local_3b0 = &local_3c8;
  __end1_1 = std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::begin(local_3b0);
  subcom = (App *)std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::end(local_3b0);
  while( true ) {
    bVar4 = __gnu_cxx::operator!=
                      (&__end1_1,
                       (__normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
                        *)&subcom);
    if (!bVar4) break;
    ppAVar12 = __gnu_cxx::
               __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
               ::operator*(&__end1_1);
    bVar3 = prefix_local._7_1_;
    bVar2 = prefix_local._6_1_;
    pAVar1 = *ppAVar12;
    local_400 = pAVar1;
    App::get_name_abi_cxx11_(&local_480,pAVar1);
    ::std::operator+(&local_460,prefix,&local_480);
    ::std::operator+(&local_440,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_460
                     ,".");
    (**(this->super_Config)._vptr_Config)
              (local_420,this,pAVar1,(ulong)(bVar3 & 1),(ulong)(bVar2 & 1),&local_440);
    ::std::operator<<(local_1a8,local_420);
    ::std::__cxx11::string::~string(local_420);
    ::std::__cxx11::string::~string((string *)&local_440);
    ::std::__cxx11::string::~string((string *)&local_460);
    ::std::__cxx11::string::~string((string *)&local_480);
    __gnu_cxx::
    __normal_iterator<const_CLI::App_**,_std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>_>
    ::operator++(&__end1_1);
  }
  std::vector<const_CLI::App_*,_std::allocator<const_CLI::App_*>_>::~vector(&local_3c8);
  ::std::__cxx11::stringstream::str();
  ::std::__cxx11::stringstream::~stringstream((stringstream *)&__range1);
  return __return_storage_ptr__;
}

Assistant:

inline std::string
ConfigINI::to_config(const App *app, bool default_also, bool write_description, std::string prefix) const {
    std::stringstream out;
    for(const Option *opt : app->get_options({})) {

        // Only process option with a long-name and configurable
        if(!opt->get_lnames().empty() && opt->get_configurable()) {
            std::string name = prefix + opt->get_lnames()[0];
            std::string value;

            // Non-flags
            if(opt->get_type_size() != 0) {

                // If the option was found on command line
                if(opt->count() > 0)
                    value = detail::ini_join(opt->results());

                // If the option has a default and is requested by optional argument
                else if(default_also && !opt->get_defaultval().empty())
                    value = opt->get_defaultval();
                // Flag, one passed
            } else if(opt->count() == 1) {
                value = "true";

                // Flag, multiple passed
            } else if(opt->count() > 1) {
                value = std::to_string(opt->count());

                // Flag, not present
            } else if(opt->count() == 0 && default_also) {
                value = "false";
            }

            if(!value.empty()) {
                if(write_description && opt->has_description()) {
                    if(static_cast<int>(out.tellp()) != 0) {
                        out << std::endl;
                    }
                    out << "; " << detail::fix_newlines("; ", opt->get_description()) << std::endl;
                }

                // Don't try to quote anything that is not size 1
                if(opt->get_items_expected() != 1)
                    out << name << "=" << value << std::endl;
                else
                    out << name << "=" << detail::add_quotes_if_needed(value) << std::endl;
            }
        }
    }

    for(const App *subcom : app->get_subcommands({}))
        out << to_config(subcom, default_also, write_description, prefix + subcom->get_name() + ".");

    return out.str();
}